

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTree::climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
          (QGraphicsSceneBspTree *this,anon_class_16_2_a6e56972 *visitor,QRectF *rect,int index)

{
  Node *pNVar1;
  Type TVar2;
  int iVar3;
  long lVar4;
  Node *pNVar5;
  QList<QGraphicsItem_*> *pQVar6;
  QGraphicsItemPrivate *pQVar7;
  ulong uVar8;
  QGraphicsItem *this_00;
  ulong uVar9;
  long in_FS_OFFSET;
  double dVar10;
  QGraphicsItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->nodes).d.size;
  do {
    if (lVar4 == 0) {
LAB_006216ba:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
    pNVar5 = (this->nodes).d.ptr;
    pNVar1 = pNVar5 + index;
    iVar3 = index * 2 + 1;
    TVar2 = pNVar5[index].type;
    if (TVar2 == Horizontal) {
      if (rect->yp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->yp) {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (this,visitor,rect,iVar3);
        dVar10 = rect->yp + rect->h;
LAB_0062160c:
        if (dVar10 < (pNVar1->field_0).offset) goto LAB_006216ba;
      }
    }
    else {
      if (TVar2 != Vertical) {
        if (TVar2 == Leaf) {
          iVar3 = (pNVar1->field_0).leafIndex;
          pQVar6 = (this->leaves).d.ptr;
          if (pQVar6[iVar3].d.size != 0) {
            uVar9 = 0;
            do {
              this_00 = pQVar6[iVar3].d.ptr[uVar9];
              if ((visitor->onlyTopLevelItems == true) &&
                 (((this_00->d_ptr).d)->parent != (QGraphicsItem *)0x0)) {
                this_00 = QGraphicsItem::topLevelItem(this_00);
              }
              pQVar7 = (this_00->d_ptr).d;
              uVar8 = *(ulong *)&pQVar7->field_0x160;
              if (((uint)uVar8 & 0x4020) == 0x20) {
                *(ulong *)&pQVar7->field_0x160 = uVar8 | 0x4000;
                local_38 = this_00;
                QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                          ((QPodArrayOps<QGraphicsItem*> *)visitor->foundItems,0,&local_38);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < (ulong)pQVar6[iVar3].d.size);
          }
        }
        goto LAB_006216ba;
      }
      if (rect->xp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->xp) {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (this,visitor,rect,iVar3);
        dVar10 = rect->xp + rect->w;
        goto LAB_0062160c;
      }
    }
    index = index * 2 + 2;
    lVar4 = (this->nodes).d.size;
  } while( true );
}

Assistant:

void QGraphicsSceneBspTree::climbTree(Visitor &&visitor, const QRectF &rect, int index) const
{
    if (nodes.isEmpty())
        return;

    const Node &node = nodes.at(index);
    const int childIndex = firstChildIndex(index);

    switch (node.type) {
    case Node::Leaf: {
        visitor(const_cast<QList<QGraphicsItem*>*>(&leaves[node.leafIndex]));
        break;
    }
    case Node::Vertical:
        if (rect.left() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.right() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
        break;
    case Node::Horizontal:
        if (rect.top() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.bottom() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
    }
}